

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void send_good_message(int id_destination,int id_taken_message)

{
  int __fd;
  uint32_t uVar1;
  uint32_t *__buf;
  mapped_type *__addr;
  void *cur_buf;
  int id_taken_message_local;
  int id_destination_local;
  
  cur_buf._0_4_ = id_taken_message;
  cur_buf._4_4_ = id_destination;
  __buf = (uint32_t *)malloc(0x10);
  uVar1 = htonl(0);
  *__buf = uVar1;
  uVar1 = htonl((uint32_t)cur_buf);
  __buf[1] = uVar1;
  __fd = socket_fd;
  __addr = std::
           map<int,_sockaddr_in,_std::less<int>,_std::allocator<std::pair<const_int,_sockaddr_in>_>_>
           ::operator[](&connections,(key_type *)((long)&cur_buf + 4));
  sendto(__fd,__buf,8,0,(sockaddr *)__addr,0x10);
  free(__buf);
  return;
}

Assistant:

void send_good_message(int id_destination, int id_taken_message) {
    void* cur_buf = malloc(16);
    ((int*)cur_buf)[0] = htonl((uint32_t)GOODMSG);
    ((int*)cur_buf)[1] = htonl((uint32_t)id_taken_message);
    sendto(socket_fd, cur_buf, 2 * sizeof(int), 0,
           (struct sockaddr *)&connections[id_destination], sizeof(struct sockaddr_in));
    free(cur_buf);
}